

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O1

void aom_highbd_filter_block1d8_h4_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined2 uVar6;
  long lVar7;
  uint uVar8;
  undefined2 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  
  auVar12 = _DAT_00519940;
  uVar9 = 0xff;
  if (bd == 0xc) {
    uVar9 = 0xfff;
  }
  uVar6 = 0x3ff;
  if (bd != 10) {
    uVar6 = uVar9;
  }
  auVar10._2_2_ = uVar6;
  auVar10._0_2_ = uVar6;
  auVar10._4_2_ = uVar6;
  auVar10._6_2_ = uVar6;
  auVar10._8_2_ = uVar6;
  auVar10._10_2_ = uVar6;
  auVar10._12_2_ = uVar6;
  auVar10._14_2_ = uVar6;
  auVar10._16_2_ = uVar6;
  auVar10._18_2_ = uVar6;
  auVar10._20_2_ = uVar6;
  auVar10._22_2_ = uVar6;
  auVar10._24_2_ = uVar6;
  auVar10._26_2_ = uVar6;
  auVar10._28_2_ = uVar6;
  auVar10._30_2_ = uVar6;
  uVar1 = *(undefined4 *)(filter + 2);
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar11._16_4_ = uVar1;
  auVar11._20_4_ = uVar1;
  auVar11._24_4_ = uVar1;
  auVar11._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(filter + 4);
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar13._16_4_ = uVar1;
  auVar13._20_4_ = uVar1;
  auVar13._24_4_ = uVar1;
  auVar13._28_4_ = uVar1;
  uVar8 = 0;
  auVar14._8_4_ = 0x40;
  auVar14._0_8_ = 0x4000000040;
  auVar14._12_4_ = 0x40;
  auVar14._16_4_ = 0x40;
  auVar14._20_4_ = 0x40;
  auVar14._24_4_ = 0x40;
  auVar14._28_4_ = 0x40;
  do {
    auVar4 = vperm2i128_avx2(*(undefined1 (*) [32])(src_ptr + (ulong)uVar8 * src_pitch + -1),
                             *(undefined1 (*) [32])(src_ptr + (ulong)(uVar8 + 1) * src_pitch + -1),
                             0x20);
    auVar5 = vperm2i128_avx2(*(undefined1 (*) [32])(src_ptr + (ulong)uVar8 * src_pitch + -1),
                             *(undefined1 (*) [32])(src_ptr + (ulong)(uVar8 + 1) * src_pitch + -1),
                             0x31);
    auVar15 = vpalignr_avx2(auVar5,auVar4,4);
    auVar3 = vpmaddwd_avx2(auVar4,auVar11);
    auVar16 = vpmaddwd_avx2(auVar15,auVar13);
    auVar15 = vpaddd_avx2(auVar3,auVar14);
    auVar15 = vpaddd_avx2(auVar15,auVar16);
    auVar16 = vpsrad_avx2(auVar15,7);
    auVar15 = vpalignr_avx2(auVar5,auVar4,2);
    auVar3 = vpalignr_avx2(auVar5,auVar4,6);
    auVar15 = vpmaddwd_avx2(auVar15,auVar11);
    auVar3 = vpmaddwd_avx2(auVar3,auVar13);
    auVar15 = vpaddd_avx2(auVar15,auVar3);
    auVar15 = vpaddd_avx2(auVar15,auVar14);
    auVar15 = vpsrad_avx2(auVar15,7);
    auVar15 = vpackssdw_avx2(auVar16,auVar15);
    auVar15 = vpshufb_avx2(auVar15,auVar12);
    auVar15 = vpminsw_avx2(auVar15,auVar10);
    auVar15 = vpmaxsw_avx2(auVar15,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    *(undefined1 (*) [16])(dst_ptr + (ulong)uVar8 * dst_pitch) = auVar15._0_16_;
    *(undefined1 (*) [16])
     ((long)*(undefined1 (*) [16])(dst_ptr + (ulong)uVar8 * dst_pitch) + dst_pitch * 2) =
         auVar15._16_16_;
    uVar8 = uVar8 + 2;
  } while (uVar8 <= height - 2);
  if ((height & 1) != 0) {
    lVar7 = src_pitch * (ulong)(height - 1);
    auVar15 = vperm2i128_avx2(*(undefined1 (*) [32])(src_ptr + lVar7 + -1),
                              *(undefined1 (*) [32])(src_ptr + lVar7 + 3),0x20);
    auVar12 = vpshufb_avx2(auVar15,_DAT_00519880);
    auVar15 = vpshufb_avx2(auVar15,_DAT_005198a0);
    auVar12 = vpmaddwd_avx2(auVar12,auVar11);
    auVar11 = vpmaddwd_avx2(auVar15,auVar13);
    auVar12 = vpaddd_avx2(auVar12,auVar11);
    auVar12 = vpaddd_avx2(auVar12,auVar14);
    auVar12 = vpsrad_avx2(auVar12,7);
    auVar12 = vpackssdw_avx2(auVar12,auVar12);
    auVar12 = vpminsw_avx2(auVar12,auVar10);
    auVar12 = vpermq_avx2(auVar12,0xe8);
    auVar2 = vpmaxsw_avx(auVar12._0_16_,(undefined1  [16])0x0);
    *(undefined1 (*) [16])(dst_ptr + dst_pitch * (ulong)(height - 1)) = auVar2;
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_h4_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  const __m256i rounding = _mm256_set1_epi32(1 << (CONV8_ROUNDING_BITS - 1));
  __m256i ff[2], s[2];
  uint32_t i = 0;
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  static const uint8_t shuffle_mask[32] = { 0, 1, 8,  9,  2, 3, 10, 11,
                                            4, 5, 12, 13, 6, 7, 14, 15,
                                            0, 1, 8,  9,  2, 3, 10, 11,
                                            4, 5, 12, 13, 6, 7, 14, 15 };

  __m256i mask = _mm256_loadu_si256((__m256i *)shuffle_mask);
  __m256i ip_mask_f2f3 = _mm256_loadu_si256((__m256i *)ip_shuffle_f2f3);
  __m256i ip_mask_f4f5 = _mm256_loadu_si256((__m256i *)ip_shuffle_f4f5);

  pack_filters_4tap(filter, ff);
  src_ptr -= 3;

  /* Horizontal filter */

  for (i = 0; i <= (height - 2); i += 2) {
    const __m256i row0 =
        _mm256_loadu_si256((__m256i *)&src_ptr[i * src_pitch + 2]);
    __m256i row1 =
        _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_pitch + 2]);

    const __m256i r0 =
        _mm256_inserti128_si256(row0, _mm256_castsi256_si128(row1), 1);
    const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

    // even pixels
    s[0] = r0;
    s[1] = _mm256_alignr_epi8(r1, r0, 4);

    __m256i res_even = convolve_4tap(s, ff);
    res_even = _mm256_srai_epi32(_mm256_add_epi32(res_even, rounding),
                                 CONV8_ROUNDING_BITS);

    // odd pixels
    s[0] = _mm256_alignr_epi8(r1, r0, 2);
    s[1] = _mm256_alignr_epi8(r1, r0, 6);

    __m256i res_odd = convolve_4tap(s, ff);
    res_odd = _mm256_srai_epi32(_mm256_add_epi32(res_odd, rounding),
                                CONV8_ROUNDING_BITS);

    __m256i res = _mm256_packs_epi32(res_even, res_odd);
    res = _mm256_shuffle_epi8(res, mask);

    res = _mm256_min_epi16(res, clip_pixel);
    res = _mm256_max_epi16(res, zero);

    _mm_storeu_si128((__m128i *)&dst_ptr[i * dst_pitch],
                     _mm256_castsi256_si128(res));
    _mm_storeu_si128((__m128i *)&dst_ptr[i * dst_pitch + dst_pitch],
                     _mm256_extracti128_si256(res, 1));
  }

  if (height % 2 != 0) {
    i = height - 1;
    const __m256i row0_0 =
        _mm256_loadu_si256((__m256i *)&src_ptr[i * src_pitch + 2]);
    const __m256i row0_1 =
        _mm256_loadu_si256((__m256i *)&src_ptr[i * src_pitch + 6]);

    const __m256i r0 =
        _mm256_inserti128_si256(row0_0, _mm256_castsi256_si128(row0_1), 1);

    s[0] = _mm256_shuffle_epi8(r0, ip_mask_f2f3);
    s[1] = _mm256_shuffle_epi8(r0, ip_mask_f4f5);

    __m256i res = convolve_4tap(s, ff);
    res =
        _mm256_srai_epi32(_mm256_add_epi32(res, rounding), CONV8_ROUNDING_BITS);

    res = _mm256_packs_epi32(res, res);
    res = _mm256_min_epi16(res, clip_pixel);
    res = _mm256_max_epi16(res, zero);

    _mm_storel_epi64((__m128i *)&dst_ptr[i * dst_pitch],
                     _mm256_castsi256_si128(res));
    _mm_storel_epi64((__m128i *)&dst_ptr[i * dst_pitch + 4],
                     _mm256_extracti128_si256(res, 1));
  }
}